

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpinternalsourcedata.h
# Opt level: O2

int __thiscall
jrtplib::RTPInternalSourceData::SetRTPDataAddress(RTPInternalSourceData *this,RTPAddress *a)

{
  RTPAddress *pRVar1;
  int iVar2;
  undefined4 extraout_var;
  
  if (a == (RTPAddress *)0x0) {
    pRVar1 = (this->super_RTPSourceData).rtpaddr;
    if (pRVar1 != (RTPAddress *)0x0) {
      RTPDelete<jrtplib::RTPAddress>(pRVar1,(this->super_RTPSourceData).super_RTPMemoryObject.mgr);
      (this->super_RTPSourceData).rtpaddr = (RTPAddress *)0x0;
    }
  }
  else {
    iVar2 = (**a->_vptr_RTPAddress)(a,(this->super_RTPSourceData).super_RTPMemoryObject.mgr);
    if ((RTPAddress *)CONCAT44(extraout_var,iVar2) == (RTPAddress *)0x0) {
      return -1;
    }
    pRVar1 = (this->super_RTPSourceData).rtpaddr;
    if (pRVar1 != a && pRVar1 != (RTPAddress *)0x0) {
      RTPDelete<jrtplib::RTPAddress>(pRVar1,(this->super_RTPSourceData).super_RTPMemoryObject.mgr);
    }
    (this->super_RTPSourceData).rtpaddr = (RTPAddress *)CONCAT44(extraout_var,iVar2);
  }
  (this->super_RTPSourceData).isrtpaddrset = true;
  return 0;
}

Assistant:

inline int RTPInternalSourceData::SetRTPDataAddress(const RTPAddress *a)
{
	if (a == 0)
	{
		if (rtpaddr)
		{
			RTPDelete(rtpaddr,GetMemoryManager());
			rtpaddr = 0;
		}
	}
	else
	{
		RTPAddress *newaddr = a->CreateCopy(GetMemoryManager());
		if (newaddr == 0)
			return ERR_RTP_OUTOFMEM;
		
		if (rtpaddr && a != rtpaddr)
			RTPDelete(rtpaddr,GetMemoryManager());
		rtpaddr = newaddr;
	}
	isrtpaddrset = true;
	return 0;
}